

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

string * cmCTestTestHandler::FindExecutable
                   (string *__return_storage_ptr__,cmCTest *ctest,string *testCommand,
                   string *resultingConfig,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *extraPaths,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *failed)

{
  pointer pbVar1;
  bool bVar2;
  char *__s;
  ostream *poVar3;
  pointer pcVar4;
  string *this;
  pointer pbVar5;
  string *f;
  uint uVar6;
  ulong uVar7;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attempted;
  pointer local_308;
  size_type local_300;
  char local_2f8;
  undefined7 uStack_2f7;
  undefined8 uStack_2f0;
  string *local_2e8;
  string *local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  attemptedConfigs;
  string filepath;
  string filenameExtra;
  string filename;
  string local_248;
  string local_228;
  string tempPath;
  string local_1e8;
  string localfilepath;
  string local_50;
  
  attempted.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attemptedConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  attempted.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attempted.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  attemptedConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  attemptedConfigs.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tempPath._M_dataplus._M_p = (pointer)&tempPath.field_2;
  tempPath._M_string_length = 0;
  tempPath.field_2._M_local_buf[0] = '\0';
  local_2e8 = __return_storage_ptr__;
  local_2e0 = resultingConfig;
  cmsys::SystemTools::GetFilenamePath(&filepath,testCommand);
  cmsys::SystemTools::GetFilenameName(&filename,testCommand);
  std::__cxx11::string::string((string *)&local_228,(string *)&filepath);
  AddConfigurations(ctest,&attempted,&attemptedConfigs,&local_228,&filename);
  std::__cxx11::string::~string((string *)&local_228);
  if (filepath._M_string_length == 0) {
LAB_00160298:
    pbVar1 = (extraPaths->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar5 = (extraPaths->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1)
    {
      cmsys::SystemTools::GetFilenamePath(&localfilepath,pbVar5);
      cmsys::SystemTools::GetFilenameName(&filenameExtra,pbVar5);
      std::__cxx11::string::string((string *)&local_1e8,(string *)&localfilepath);
      AddConfigurations(ctest,&attempted,&attemptedConfigs,&local_1e8,&filenameExtra);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&filenameExtra);
      std::__cxx11::string::~string((string *)&localfilepath);
    }
  }
  else if (*filepath._M_dataplus._M_p == '/') {
    std::__cxx11::string::substr((ulong)&localfilepath,(ulong)&filepath);
    std::__cxx11::string::string((string *)&local_248,(string *)&localfilepath);
    AddConfigurations(ctest,&attempted,&attemptedConfigs,&local_248,&filename);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&localfilepath);
    if (filepath._M_string_length == 0) goto LAB_00160298;
  }
  local_308 = &local_2f8;
  local_300 = 0;
  local_2f8 = '\0';
  for (uVar6 = 0; this = local_2e8, uVar7 = (ulong)uVar6,
      uVar7 < (ulong)((long)attempted.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)attempted.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar6 = uVar6 + 1) {
    if (local_300 != 0) goto LAB_00160268;
    bVar2 = cmsys::SystemTools::FileExists
                      (attempted.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar7);
    if ((!bVar2) ||
       (bVar2 = cmsys::SystemTools::FileIsDirectory
                          (attempted.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar7), bVar2)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(failed,attempted.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + uVar7);
      localfilepath._M_string_length =
           (size_type)
           attempted.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_dataplus._M_p;
      localfilepath._M_dataplus._M_p =
           (pointer)attempted.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[uVar7]._M_string_length;
      __s = cmsys::SystemTools::GetExecutableExtension();
      filenameExtra._M_dataplus._M_p = (pointer)strlen(__s);
      filenameExtra._M_string_length = (size_type)__s;
      cmStrCat<>(&local_50,(cmAlphaNum *)&localfilepath,(cmAlphaNum *)&filenameExtra);
      std::__cxx11::string::operator=((string *)&tempPath,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      bVar2 = cmsys::SystemTools::FileExists(&tempPath);
      if ((bVar2) && (bVar2 = cmsys::SystemTools::FileIsDirectory(&tempPath), !bVar2)) {
        cmsys::SystemTools::CollapseFullPath(&localfilepath,&tempPath);
        goto LAB_00160230;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(failed,&tempPath);
    }
    else {
      cmsys::SystemTools::CollapseFullPath
                (&localfilepath,
                 attempted.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar7);
LAB_00160230:
      std::__cxx11::string::operator=((string *)&local_308,(string *)&localfilepath);
      std::__cxx11::string::~string((string *)&localfilepath);
      std::__cxx11::string::_M_assign((string *)local_2e0);
    }
  }
  if (local_300 == 0) {
    if (filepath._M_string_length == 0) {
      localfilepath._M_dataplus._M_p = (pointer)0x0;
      localfilepath._M_string_length = 0;
      localfilepath.field_2._M_allocated_capacity = 0;
      cmsys::SystemTools::FindProgram
                (local_2e8,filename._M_dataplus._M_p,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&localfilepath,false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&localfilepath);
      if (this->_M_string_length != 0) {
        local_2e0->_M_string_length = 0;
        pcVar4 = (local_2e0->_M_dataplus)._M_p;
        goto LAB_00160336;
      }
      std::__cxx11::string::~string((string *)this);
      if (local_300 != 0) goto LAB_00160268;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&localfilepath);
    poVar3 = std::operator<<((ostream *)&localfilepath,"Could not find executable ");
    poVar3 = std::operator<<(poVar3,(string *)testCommand);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"Looked in the following places:\n");
    std::__cxx11::stringbuf::str();
    cmCTest::Log(ctest,2,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                 ,0x6dd,filenameExtra._M_dataplus._M_p,false);
    std::__cxx11::string::~string((string *)&filenameExtra);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&localfilepath);
    pbVar1 = (failed->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar5 = (failed->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar1; pbVar5 = pbVar5 + 1)
    {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&localfilepath);
      poVar3 = std::operator<<((ostream *)&localfilepath,(string *)pbVar5);
      std::operator<<(poVar3,"\n");
      std::__cxx11::stringbuf::str();
      cmCTest::Log(ctest,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x6df,filenameExtra._M_dataplus._M_p,false);
      std::__cxx11::string::~string((string *)&filenameExtra);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&localfilepath);
    }
  }
LAB_00160268:
  (local_2e8->_M_dataplus)._M_p = (pointer)&local_2e8->field_2;
  pcVar4 = &local_2f8;
  if (local_308 == pcVar4) {
    (local_2e8->field_2)._M_allocated_capacity = CONCAT71(uStack_2f7,local_2f8);
    *(undefined8 *)((long)&local_2e8->field_2 + 8) = uStack_2f0;
  }
  else {
    (local_2e8->_M_dataplus)._M_p = local_308;
    (local_2e8->field_2)._M_allocated_capacity = CONCAT71(uStack_2f7,local_2f8);
  }
  local_2e8->_M_string_length = local_300;
  local_300 = 0;
  this = local_2e8;
  local_308 = pcVar4;
LAB_00160336:
  *pcVar4 = '\0';
  std::__cxx11::string::~string((string *)&local_308);
  std::__cxx11::string::~string((string *)&filename);
  std::__cxx11::string::~string((string *)&filepath);
  std::__cxx11::string::~string((string *)&tempPath);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&attemptedConfigs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&attempted);
  return this;
}

Assistant:

std::string cmCTestTestHandler::FindExecutable(
  cmCTest* ctest, const std::string& testCommand, std::string& resultingConfig,
  std::vector<std::string>& extraPaths, std::vector<std::string>& failed)
{
  // now run the compiled test if we can find it
  std::vector<std::string> attempted;
  std::vector<std::string> attemptedConfigs;
  std::string tempPath;
  std::string filepath = cmSystemTools::GetFilenamePath(testCommand);
  std::string filename = cmSystemTools::GetFilenameName(testCommand);

  cmCTestTestHandler::AddConfigurations(ctest, attempted, attemptedConfigs,
                                        filepath, filename);

  // even if a fullpath was specified also try it relative to the current
  // directory
  if (!filepath.empty() && filepath[0] == '/') {
    std::string localfilepath = filepath.substr(1, filepath.size() - 1);
    cmCTestTestHandler::AddConfigurations(ctest, attempted, attemptedConfigs,
                                          localfilepath, filename);
  }

  // if extraPaths are provided and we were not passed a full path, try them,
  // try any extra paths
  if (filepath.empty()) {
    for (std::string const& extraPath : extraPaths) {
      std::string filepathExtra = cmSystemTools::GetFilenamePath(extraPath);
      std::string filenameExtra = cmSystemTools::GetFilenameName(extraPath);
      cmCTestTestHandler::AddConfigurations(ctest, attempted, attemptedConfigs,
                                            filepathExtra, filenameExtra);
    }
  }

  // store the final location in fullPath
  std::string fullPath;

  // now look in the paths we specified above
  for (unsigned int ai = 0; ai < attempted.size() && fullPath.empty(); ++ai) {
    // first check without exe extension
    if (cmSystemTools::FileExists(attempted[ai]) &&
        !cmSystemTools::FileIsDirectory(attempted[ai])) {
      fullPath = cmSystemTools::CollapseFullPath(attempted[ai]);
      resultingConfig = attemptedConfigs[ai];
    }
    // then try with the exe extension
    else {
      failed.push_back(attempted[ai]);
      tempPath =
        cmStrCat(attempted[ai], cmSystemTools::GetExecutableExtension());
      if (cmSystemTools::FileExists(tempPath) &&
          !cmSystemTools::FileIsDirectory(tempPath)) {
        fullPath = cmSystemTools::CollapseFullPath(tempPath);
        resultingConfig = attemptedConfigs[ai];
      } else {
        failed.push_back(tempPath);
      }
    }
  }

  // if everything else failed, check the users path, but only if a full path
  // wasn't specified
  if (fullPath.empty() && filepath.empty()) {
    std::string path = cmSystemTools::FindProgram(filename.c_str());
    if (!path.empty()) {
      resultingConfig.clear();
      return path;
    }
  }
  if (fullPath.empty()) {
    cmCTestLog(ctest, HANDLER_OUTPUT,
               "Could not find executable "
                 << testCommand << "\n"
                 << "Looked in the following places:\n");
    for (std::string const& f : failed) {
      cmCTestLog(ctest, HANDLER_OUTPUT, f << "\n");
    }
  }

  return fullPath;
}